

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::mainLoop(CPU *this,bool debug)

{
  byte bVar1;
  
  while (this->isRunning == true) {
    if (debug) {
      bVar1 = Memory::Read8(this->m,this->PC);
      printf("insn %02x\n",(ulong)bVar1);
      execute(this);
      printState(this);
    }
    else {
      execute(this);
    }
  }
  return;
}

Assistant:

void CPU::mainLoop(bool debug = false) {
    while (isRunning) {
        if (debug)
            printf("insn %02x\n", m->Read8(PC));

        execute();

        if (debug)
            printState();
    }
}